

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O3

int json_pointer_set_with_array_cb
              (json_object **obj,char *path,json_object *value,
              json_pointer_array_set_cb array_set_cb,void *priv)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *path_00;
  json_pointer_get_result local_50;
  
  if (obj != (json_object **)0x0 && path != (char *)0x0) {
    if (*path == '/') {
      pcVar3 = strrchr(path,0x2f);
      if ((long)pcVar3 - (long)path == 0) {
        iVar1 = json_pointer_set_single_path(*obj,path + 1,value,array_set_cb,priv);
        return iVar1;
      }
      path_00 = strdup(path);
      if (path_00 == (char *)0x0) {
        piVar2 = __errno_location();
        *piVar2 = 0xc;
        return -1;
      }
      path_00[(long)pcVar3 - (long)path] = '\0';
      iVar1 = json_pointer_result_get_recursive(*obj,path_00,&local_50);
      if (iVar1 == 0) {
        free(path_00);
        iVar1 = json_pointer_set_single_path(local_50.obj,pcVar3 + 1,value,array_set_cb,priv);
        return iVar1;
      }
      free(path_00);
      return iVar1;
    }
    if (*path == '\0') {
      json_object_put(*obj);
      *obj = value;
      return 0;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int json_pointer_set_with_array_cb(struct json_object **obj, const char *path,
				   struct json_object *value,
				   json_pointer_array_set_cb array_set_cb, void *priv)
{
	const char *endp;
	char *path_copy = NULL;
	struct json_object *set = NULL;
	int rc;

	if (!obj || !path)
	{
		errno = EINVAL;
		return -1;
	}

	if (path[0] == '\0')
	{
		json_object_put(*obj);
		*obj = value;
		return 0;
	}

	if (path[0] != '/')
	{
		errno = EINVAL;
		return -1;
	}

	/* If there's only 1 level to set, stop here */
	if ((endp = strrchr(path, '/')) == path)
	{
		path++;
		return json_pointer_set_single_path(*obj, path, value, array_set_cb, priv);
	}

	/* pass a working copy to the recursive call */
	if (!(path_copy = strdup(path)))
	{
		errno = ENOMEM;
		return -1;
	}
	path_copy[endp - path] = '\0';
	rc = json_pointer_object_get_recursive(*obj, path_copy, &set);
	free(path_copy);

	if (rc)
		return rc;

	endp++;
	return json_pointer_set_single_path(set, endp, value, array_set_cb, priv);
}